

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::~QArrayDataPointer
          (QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *this)

{
  bool bVar1;
  QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *in_RDI;
  
  bVar1 = deref(in_RDI);
  if (!bVar1) {
    operator->(in_RDI);
    QtPrivate::QGenericArrayOps<(anonymous_namespace)::QDnsCachedName>::destroyAll
              ((QGenericArrayOps<(anonymous_namespace)::QDnsCachedName> *)in_RDI);
    QTypedArrayData<(anonymous_namespace)::QDnsCachedName>::deallocate((QArrayData *)0x36481b);
  }
  return;
}

Assistant:

~QArrayDataPointer()
    {
        if (!deref()) {
            (*this)->destroyAll();
            Data::deallocate(d);
        }
    }